

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O2

int __thiscall
TPZCompElHDiv<pzshape::TPZShapeQuad>::ConnectOrder
          (TPZCompElHDiv<pzshape::TPZShapeQuad> *this,int connect)

{
  int iVar1;
  long lVar2;
  ostream *poVar3;
  uint uVar4;
  string local_1c0 [32];
  stringstream sout;
  ostream local_190 [376];
  
  uVar4 = 0xffffffff;
  if (-1 < connect) {
    iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x90))();
    if (connect < iVar1) {
      if ((this->fConnectIndexes).super_TPZVec<long>.fStore[(uint)connect] == -1) {
        std::__cxx11::stringstream::stringstream((stringstream *)&sout);
        poVar3 = std::operator<<(local_190,
                                 "virtual int TPZCompElHDiv<pzshape::TPZShapeQuad>::ConnectOrder(int) const [TSHAPE = pzshape::TPZShapeQuad]"
                                );
        poVar3 = std::operator<<(poVar3," connect ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,connect);
        poVar3 = std::operator<<(poVar3," is not initialized");
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::stringbuf::str();
        poVar3 = std::operator<<((ostream *)&std::cout,local_1c0);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::string::~string(local_1c0);
        std::__cxx11::stringstream::~stringstream((stringstream *)&sout);
        uVar4 = 0;
      }
      else {
        lVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                       super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                       super_TPZCompEl + 0xa8))(this,(ulong)(uint)connect);
        uVar4 = (uint)*(byte *)(lVar2 + 0x14);
      }
    }
  }
  return uVar4;
}

Assistant:

int TPZCompElHDiv<TSHAPE>::ConnectOrder(int connect) const{
	if (connect < 0 || connect >= this->NConnects()){
#ifdef PZ_LOG
		{
			std::stringstream sout;
			sout << "Connect index out of range connect " << connect <<
			" nconnects " << NConnects();
			LOGPZ_DEBUG(logger,sout.str())
		}
#endif
		return -1;
	}

	if (this->fConnectIndexes[connect] == -1) {
		std::stringstream sout;
		sout << __PRETTY_FUNCTION__ << " connect " << connect
		<< " is not initialized" << std::endl;
#ifdef PZ_LOG
		LOGPZ_ERROR(logger,sout.str());
#else
		std::cout << sout.str() << std::endl;
#endif
		return 0;
	}

    TPZConnect &c = this-> Connect(connect);
    return c.Order();
}